

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_scan.cc
# Opt level: O0

void __thiscall hwtest::pgraph::anon_unknown_2::ScanDebugTest::~ScanDebugTest(ScanDebugTest *this)

{
  ScanDebugTest *this_local;
  
  ~ScanDebugTest(this);
  operator_delete(this);
  return;
}

Assistant:

int run() override {
		if (chipset.card_type < 3) {
			nva_wr32(cnum, 0x4006a4, 0x0f000111);
		}
		for (auto &reg : pgraph_debug_regs(chipset)) {
			if (reg->scan_test(cnum, rnd))
				res = HWTEST_RES_FAIL;
		}
		if (chipset.card_type < 0x10) {
		} else if (chipset.card_type < 0x20) {
			bool is_nv17p = nv04_pgraph_is_nv17p(&chipset);
			bitscan(0x400080, is_nv17p ? 0x0007ffff : 0x0003ffff, 0);
		} else if (chipset.card_type < 0x30) {
			bool is_nv25p = nv04_pgraph_is_nv25p(&chipset);
			bitscan(0x400080, is_nv25p ? 0x07ffefff : 0x03ffefff, 0);
		} else if (chipset.card_type < 0x40) {
			bitscan(0x400080, chipset.chipset == 0x34 ? 0x7fffffff : 0x3fffffff, 0);
		} else {
			bitscan(0x400080, 0x00000107, 0);
		}
		
		return res;
	}